

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qtreeview.cpp
# Opt level: O2

void QTreeView::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  bool bVar2;
  byte bVar3;
  undefined4 uVar4;
  int depth;
  QModelIndex *index;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      expanded((QTreeView *)_o,(QModelIndex *)_a[1]);
      return;
    case 1:
      collapsed((QTreeView *)_o,(QModelIndex *)_a[1]);
      return;
    case 2:
      hideColumn((QTreeView *)_o,*_a[1]);
      return;
    case 3:
      showColumn((QTreeView *)_o,*_a[1]);
      return;
    case 4:
      expand((QTreeView *)_o,(QModelIndex *)_a[1]);
      return;
    case 5:
      collapse((QTreeView *)_o,(QModelIndex *)_a[1]);
      return;
    case 6:
      resizeColumnToContents((QTreeView *)_o,*_a[1]);
      return;
    case 7:
      sortByColumn((QTreeView *)_o,*_a[1],*_a[2]);
      return;
    case 8:
      expandAll((QTreeView *)_o);
      return;
    case 9:
      index = (QModelIndex *)_a[1];
      depth = *_a[2];
      break;
    case 10:
      index = (QModelIndex *)_a[1];
      depth = -1;
      break;
    case 0xb:
      collapseAll((QTreeView *)_o);
      return;
    case 0xc:
      expandToDepth((QTreeView *)_o,*_a[1]);
      return;
    case 0xd:
      columnResized((QTreeView *)_o,*_a[1],_id,0x675444);
      return;
    case 0xe:
      columnCountChanged((QTreeView *)_o,*_a[1],*_a[2]);
      return;
    case 0xf:
      columnMoved((QTreeView *)_o);
      return;
    default:
      goto switchD_00548b7d_caseD_10;
    case 0x11:
      rowsRemoved((QTreeView *)_o,(QModelIndex *)_a[1],*_a[2],*_a[3]);
      return;
    case 0x12:
      (**(code **)(*(long *)_o + 0x280))(_o,*_a[1]);
      return;
    }
    expandRecursively((QTreeView *)_o,index,depth);
    return;
  case ReadProperty:
    if (10 < (uint)_id) {
      return;
    }
    switch(_id) {
    case 0:
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x618);
      goto LAB_00548cf9;
    case 1:
      uVar4 = *(undefined4 *)(*(long *)(_o + 8) + 0x598);
LAB_00548cf9:
      *(undefined4 *)*_a = uVar4;
      return;
    case 2:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c1);
      break;
    case 3:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c0);
      break;
    case 4:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c2);
      break;
    case 5:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c3);
      break;
    case 6:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5e0);
      break;
    case 7:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c5);
      break;
    case 8:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x491);
      break;
    case 9:
      bVar3 = *(byte *)(*(long *)(*(long *)(*(long *)(_o + 8) + 0x590) + 0x20) + 10) & 1;
      break;
    case 10:
      bVar3 = *(byte *)(*(long *)(_o + 8) + 0x5c4);
    }
    *(byte *)*_a = bVar3;
    break;
  case WriteProperty:
    if ((uint)_id < 0xb) {
      piVar1 = (int *)*_a;
      switch(_id) {
      case 0:
        *(int *)(*(long *)(_o + 8) + 0x618) = *piVar1;
        break;
      case 1:
        setIndentation((QTreeView *)_o,*piVar1);
        return;
      case 2:
        setRootIsDecorated((QTreeView *)_o,SUB41(*piVar1,0));
        return;
      case 3:
        *(char *)(*(long *)(_o + 8) + 0x5c0) = (char)*piVar1;
        break;
      case 4:
        *(char *)(*(long *)(_o + 8) + 0x5c2) = (char)*piVar1;
        break;
      case 5:
        setSortingEnabled((QTreeView *)_o,SUB41(*piVar1,0));
        return;
      case 6:
        *(char *)(*(long *)(_o + 8) + 0x5e0) = (char)*piVar1;
        break;
      case 7:
        setAllColumnsShowFocus((QTreeView *)_o,SUB41(*piVar1,0));
        return;
      case 8:
        setWordWrap((QTreeView *)_o,SUB41(*piVar1,0));
        return;
      case 9:
        setHeaderHidden((QTreeView *)_o,SUB41(*piVar1,0));
        return;
      case 10:
        *(char *)(*(long *)(_o + 8) + 0x5c4) = (char)*piVar1;
      }
    }
    break;
  default:
    if (_id == 1 && _c == ResetProperty) {
      resetIndentation((QTreeView *)_o);
      return;
    }
    break;
  case IndexOfMethod:
    bVar2 = QtMocHelpers::indexOfMethod<void(QTreeView::*)(QModelIndex_const&)>
                      ((QtMocHelpers *)_a,(void **)expanded,0,0);
    if (!bVar2) {
      QtMocHelpers::indexOfMethod<void(QTreeView::*)(QModelIndex_const&)>
                ((QtMocHelpers *)_a,(void **)collapsed,0,1);
      return;
    }
  }
switchD_00548b7d_caseD_10:
  return;
}

Assistant:

void QTreeView::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QTreeView *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->expanded((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 1: _t->collapsed((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 2: _t->hideColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->showColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 4: _t->expand((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 5: _t->collapse((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 6: _t->resizeColumnToContents((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->sortByColumn((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<Qt::SortOrder>>(_a[2]))); break;
        case 8: _t->expandAll(); break;
        case 9: _t->expandRecursively((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 10: _t->expandRecursively((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 11: _t->collapseAll(); break;
        case 12: _t->expandToDepth((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 13: _t->columnResized((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->columnCountChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        case 15: _t->columnMoved(); break;
        case 16: _t->reexpand(); break;
        case 17: _t->rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 18: _t->verticalScrollbarValueChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QTreeView::*)(const QModelIndex & )>(_a, &QTreeView::expanded, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QTreeView::*)(const QModelIndex & )>(_a, &QTreeView::collapsed, 1))
            return;
    }
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->autoExpandDelay(); break;
        case 1: *reinterpret_cast<int*>(_v) = _t->indentation(); break;
        case 2: *reinterpret_cast<bool*>(_v) = _t->rootIsDecorated(); break;
        case 3: *reinterpret_cast<bool*>(_v) = _t->uniformRowHeights(); break;
        case 4: *reinterpret_cast<bool*>(_v) = _t->itemsExpandable(); break;
        case 5: *reinterpret_cast<bool*>(_v) = _t->isSortingEnabled(); break;
        case 6: *reinterpret_cast<bool*>(_v) = _t->isAnimated(); break;
        case 7: *reinterpret_cast<bool*>(_v) = _t->allColumnsShowFocus(); break;
        case 8: *reinterpret_cast<bool*>(_v) = _t->wordWrap(); break;
        case 9: *reinterpret_cast<bool*>(_v) = _t->isHeaderHidden(); break;
        case 10: *reinterpret_cast<bool*>(_v) = _t->expandsOnDoubleClick(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setAutoExpandDelay(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setIndentation(*reinterpret_cast<int*>(_v)); break;
        case 2: _t->setRootIsDecorated(*reinterpret_cast<bool*>(_v)); break;
        case 3: _t->setUniformRowHeights(*reinterpret_cast<bool*>(_v)); break;
        case 4: _t->setItemsExpandable(*reinterpret_cast<bool*>(_v)); break;
        case 5: _t->setSortingEnabled(*reinterpret_cast<bool*>(_v)); break;
        case 6: _t->setAnimated(*reinterpret_cast<bool*>(_v)); break;
        case 7: _t->setAllColumnsShowFocus(*reinterpret_cast<bool*>(_v)); break;
        case 8: _t->setWordWrap(*reinterpret_cast<bool*>(_v)); break;
        case 9: _t->setHeaderHidden(*reinterpret_cast<bool*>(_v)); break;
        case 10: _t->setExpandsOnDoubleClick(*reinterpret_cast<bool*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->resetIndentation(); break;
        default: break;
        }
    }
}